

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.h
# Opt level: O1

int __thiscall
aeron::Image::
controlledPoll<std::function<aeron::ControlledPollAction(aeron::concurrent::AtomicBuffer&,int,int,aeron::concurrent::logbuffer::Header&)>&>
          (Image *this,
          function<aeron::ControlledPollAction_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&)>
          *fragmentHandler,int fragmentLimit)

{
  length_t lVar1;
  int iVar2;
  index_t index;
  bool bVar3;
  ControlledPollAction CVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  AtomicBuffer *this_00;
  uint index_00;
  uint uVar8;
  uint local_6c;
  ulong local_60;
  int local_50;
  int local_4c;
  AtomicBuffer *local_48;
  Header *local_40;
  _Any_data *local_38;
  
  iVar7 = 0;
  if (((this->m_isClosed)._M_base._M_i & 1U) == 0) {
    local_48 = (AtomicBuffer *)&this->m_subscriberPosition;
    iVar7 = (this->m_subscriberPosition).
            super_ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition>.m_impl.m_offset;
    local_38 = (_Any_data *)fragmentHandler;
    concurrent::AtomicBuffer::boundsCheck(local_48,iVar7,8);
    local_60 = *(ulong *)((this->m_subscriberPosition).
                          super_ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition>.
                          m_impl.m_buffer.m_buffer + iVar7);
    uVar6 = (local_60 >> ((byte)this->m_positionBitsToShift & 0x3f)) % 3;
    index_00 = this->m_termLengthMask & (uint)local_60;
    this_00 = (this->m_termBuffers)._M_elems + uVar6;
    lVar1 = (this->m_termBuffers)._M_elems[uVar6].m_length;
    local_40 = &this->m_header;
    (this->m_header).m_buffer.m_buffer = (this->m_termBuffers)._M_elems[uVar6].m_buffer;
    (this->m_header).m_buffer.m_length = lVar1;
    iVar7 = 0;
    local_6c = index_00;
    do {
      if ((fragmentLimit <= iVar7) || ((int)lVar1 <= (int)index_00)) break;
      concurrent::AtomicBuffer::boundsCheck(this_00,index_00,4);
      iVar2 = *(int *)((this->m_termBuffers)._M_elems[uVar6].m_buffer + (int)index_00);
      bVar3 = true;
      if (0 < iVar2) {
        uVar8 = (iVar2 + 0x1fU & 0xffffffe0) + index_00;
        lVar5 = (long)(int)index_00 + 6;
        concurrent::AtomicBuffer::boundsCheck(this_00,(index_t)lVar5,2);
        if (*(short *)((this->m_termBuffers)._M_elems[uVar6].m_buffer + lVar5) == 0) {
LAB_0013d435:
          bVar3 = false;
          index_00 = uVar8;
        }
        else {
          (this->m_header).m_offset = index_00;
          local_4c = index_00 + 0x20;
          local_50 = iVar2 + -0x20;
          if (*(long *)(local_38 + 1) == 0) {
            std::__throw_bad_function_call();
          }
          CVar4 = (**(code **)(local_38->_M_pod_data + 0x18))
                            (local_38,this_00,&local_4c,&local_50,local_40);
          if ((CVar4 == ABORT) || (iVar7 = iVar7 + 1, index_00 = uVar8, CVar4 == BREAK)) {
            bVar3 = true;
          }
          else {
            if (CVar4 != COMMIT) goto LAB_0013d435;
            local_60 = local_60 + (long)(int)(uVar8 - local_6c);
            index = (this->m_subscriberPosition).
                    super_ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition>.m_impl.
                    m_offset;
            concurrent::AtomicBuffer::boundsCheck(local_48,index,8);
            *(ulong *)((this->m_subscriberPosition).
                       super_ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition>.
                       m_impl.m_buffer.m_buffer + index) = local_60;
            bVar3 = false;
            local_6c = uVar8;
          }
        }
      }
    } while (!bVar3);
    if (index_00 - local_6c != 0 && (int)local_6c <= (int)index_00) {
      iVar2 = (this->m_subscriberPosition).
              super_ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition>.m_impl.
              m_offset;
      concurrent::AtomicBuffer::boundsCheck(local_48,iVar2,8);
      *(ulong *)((this->m_subscriberPosition).
                 super_ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition>.m_impl.
                 m_buffer.m_buffer + iVar2) = local_60 + (index_00 - local_6c);
    }
  }
  return iVar7;
}

Assistant:

inline int controlledPoll(F&& fragmentHandler, int fragmentLimit)
    {
        int result = 0;

        if (!isClosed())
        {
            int fragmentsRead = 0;
            std::int64_t initialPosition = m_subscriberPosition.get();
            std::int32_t initialOffset = (std::int32_t) initialPosition & m_termLengthMask;
            const int index = LogBufferDescriptor::indexByPosition(initialPosition, m_positionBitsToShift);
            assert(index >= 0 && index < LogBufferDescriptor::PARTITION_COUNT);
            AtomicBuffer &termBuffer = m_termBuffers[index];
            std::int32_t resultingOffset = initialOffset;
            const util::index_t capacity = termBuffer.capacity();

            m_header.buffer(termBuffer);

            try
            {
                while (fragmentsRead < fragmentLimit && resultingOffset < capacity)
                {
                    const std::int32_t length = FrameDescriptor::frameLengthVolatile(termBuffer, resultingOffset);
                    if (length <= 0)
                    {
                        break;
                    }

                    const std::int32_t frameOffset = resultingOffset;
                    const std::int32_t alignedLength = util::BitUtil::align(length, FrameDescriptor::FRAME_ALIGNMENT);
                    resultingOffset += alignedLength;

                    if (FrameDescriptor::isPaddingFrame(termBuffer, frameOffset))
                    {
                        continue;
                    }

                    m_header.offset(frameOffset);

                    const ControlledPollAction action = fragmentHandler(
                        termBuffer,
                        frameOffset + DataFrameHeader::LENGTH,
                        length - DataFrameHeader::LENGTH,
                        m_header);

                    if (ControlledPollAction::ABORT == action)
                    {
                        resultingOffset -= alignedLength;
                        break;
                    }

                    ++fragmentsRead;

                    if (ControlledPollAction::BREAK == action)
                    {
                        break;
                    }
                    else if (ControlledPollAction::COMMIT == action)
                    {
                        initialPosition += (resultingOffset - initialOffset);
                        initialOffset = resultingOffset;
                        m_subscriberPosition.setOrdered(initialPosition);
                    }
                }
            }
            catch (const std::exception& ex)
            {
                m_exceptionHandler(ex);
            }

            const std::int64_t resultingPosition = initialPosition + (resultingOffset - initialOffset);
            if (resultingPosition > initialPosition)
            {
                m_subscriberPosition.setOrdered(resultingPosition);
            }

            result = fragmentsRead;
        }

        return result;
    }